

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorBase<slang::IntervalMapDetails::Path::Entry> * __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pEVar6;
  pointer pEVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  if (this != rhs) {
    uVar3 = this->len;
    uVar4 = rhs->len;
    if (uVar3 < uVar4) {
      if (this->cap < uVar4) {
        this->len = 0;
        reserve(this,rhs->len);
      }
      else if (0 < (long)uVar3) {
        pEVar6 = this->data_;
        pEVar7 = rhs->data_;
        lVar9 = uVar3 + 1;
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pEVar7->node + lVar10);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pEVar6->node + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar9 = lVar9 + -1;
          lVar10 = lVar10 + 0x10;
        } while (1 < lVar9);
      }
      sVar5 = rhs->len;
      if (this->len != sVar5) {
        pEVar6 = rhs->data_;
        pEVar7 = this->data_;
        lVar9 = this->len << 4;
        do {
          puVar1 = (undefined8 *)((long)&pEVar6->node + lVar9);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pEVar7->node + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          bVar11 = sVar5 * 0x10 + -0x10 == lVar9;
          if (bVar11) break;
          lVar9 = lVar9 + 0x10;
        } while (!bVar11);
      }
    }
    else if (0 < (long)uVar4) {
      pEVar6 = rhs->data_;
      pEVar7 = this->data_;
      lVar9 = uVar4 + 1;
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pEVar6->node + lVar10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar7->node + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        lVar9 = lVar9 + -1;
        lVar10 = lVar10 + 0x10;
      } while (1 < lVar9);
    }
    this->len = rhs->len;
  }
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(const SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return *this;

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::copy(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::copy(rhs.begin(), rhs.begin() + len, begin());
    }

    // Copy construct the new elements in place.
    std::ranges::uninitialized_copy(rhs.begin() + len, rhs.end(), begin() + len,
                                    begin() + rhs.size());
    len = rhs.size();
    return *this;
}